

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpBranchind::printRaw(TypeOpBranchind *this,ostream *s,PcodeOp *op)

{
  ostream *poVar1;
  Varnode *this_00;
  PcodeOp *op_local;
  ostream *s_local;
  TypeOpBranchind *this_local;
  
  poVar1 = std::operator<<(s,(string *)&(this->super_TypeOp).name);
  std::operator<<(poVar1,' ');
  this_00 = PcodeOp::getIn(op,0);
  Varnode::printRaw(this_00,s);
  return;
}

Assistant:

void TypeOpBranchind::printRaw(ostream &s,const PcodeOp *op)

{
  s << name << ' ';
  op->getIn(0)->printRaw(s);
}